

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O2

void __thiscall
lzham::vector<lzham::symbol_codec::output_symbol>::clear
          (vector<lzham::symbol_codec::output_symbol> *this)

{
  if (this->m_p != (output_symbol *)0x0) {
    lzham_free(this->m_p);
    this->m_p = (output_symbol *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            lzham_free(m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }